

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  void **ppvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FieldDescriptorProto *field;
  DescriptorProto *message_00;
  EnumDescriptorProto *enum_type;
  MessageOptions *options;
  int iVar5;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar3 = true;
  if (!bVar2) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) {
      iVar4 = (message->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      LocationRecorder::Init(&LStack_38,message_location);
      LocationRecorder::AddPath(&LStack_38,3);
      LocationRecorder::AddPath(&LStack_38,iVar4);
      iVar4 = (message->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (message->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar1 = (message->nested_type_).super_RepeatedPtrFieldBase.elements_;
        (message->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        message_00 = (DescriptorProto *)ppvVar1[iVar4];
      }
      else {
        if (iVar5 == (message->nested_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(message->nested_type_).super_RepeatedPtrFieldBase,iVar5 + 1);
          iVar5 = (message->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (message->nested_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar5 + 1;
        message_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar1 = (message->nested_type_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (message->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        (message->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar1[iVar4] = message_00;
      }
      bVar3 = ParseMessageDefinition(this,message_00,&LStack_38);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar4 == 0) {
        iVar4 = (message->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        LocationRecorder::Init(&LStack_38,message_location);
        LocationRecorder::AddPath(&LStack_38,4);
        LocationRecorder::AddPath(&LStack_38,iVar4);
        iVar4 = (message->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        iVar5 = (message->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        if (iVar4 < iVar5) {
          ppvVar1 = (message->enum_type_).super_RepeatedPtrFieldBase.elements_;
          (message->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
          enum_type = (EnumDescriptorProto *)ppvVar1[iVar4];
        }
        else {
          if (iVar5 == (message->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
            internal::RepeatedPtrFieldBase::Reserve
                      (&(message->enum_type_).super_RepeatedPtrFieldBase,iVar5 + 1);
            iVar5 = (message->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
          }
          (message->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar5 + 1;
          enum_type = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
          ppvVar1 = (message->enum_type_).super_RepeatedPtrFieldBase.elements_;
          iVar4 = (message->enum_type_).super_RepeatedPtrFieldBase.current_size_;
          (message->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
          ppvVar1[iVar4] = enum_type;
        }
        bVar3 = ParseEnumDefinition(this,enum_type,&LStack_38);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar4 == 0) {
          LocationRecorder::Init(&LStack_38,message_location);
          LocationRecorder::AddPath(&LStack_38,5);
          bVar3 = ParseExtensions(this,message,&LStack_38);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar4 == 0) {
            LocationRecorder::Init(&LStack_38,message_location);
            LocationRecorder::AddPath(&LStack_38,6);
            bVar3 = ParseExtend(this,&message->extension_,&message->nested_type_,message_location,3,
                                &LStack_38);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              LocationRecorder::Init(&LStack_38,message_location);
              LocationRecorder::AddPath(&LStack_38,7);
              options = DescriptorProto::mutable_options(message);
              bVar3 = ParseOption(this,&options->super_Message,&LStack_38,OPTION_STATEMENT);
            }
            else {
              LocationRecorder::LocationRecorder
                        (&LStack_38,message_location,2,
                         (message->field_).super_RepeatedPtrFieldBase.current_size_);
              field = DescriptorProto::add_field(message);
              bVar3 = ParseMessageField(this,field,&message->nested_type_,message_location,3,
                                        &LStack_38);
            }
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&LStack_38);
  }
  return bVar3;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(),
                       message_location,
                       DescriptorProto::kNestedTypeFieldNumber,
                       location);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, OPTION_STATEMENT);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(message->add_field(),
                             message->mutable_nested_type(),
                             message_location,
                             DescriptorProto::kNestedTypeFieldNumber,
                             location);
  }
}